

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# accessors.h
# Opt level: O0

_Bool upb_Message_HasBaseField(upb_Message *msg,upb_MiniTableField *field)

{
  _Bool _Var1;
  uint32_t uVar2;
  uint32_t uVar3;
  upb_MiniTableField *field_local;
  upb_Message *msg_local;
  
  _Var1 = upb_MiniTableField_HasPresence(field);
  if (!_Var1) {
    __assert_fail("upb_MiniTableField_HasPresence(field)",
                  "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/upb/message/internal/accessors.h"
                  ,0xfa,
                  "_Bool upb_Message_HasBaseField(const struct upb_Message *, const upb_MiniTableField *)"
                 );
  }
  _Var1 = upb_MiniTableField_IsExtension(field);
  if (!_Var1) {
    _Var1 = upb_MiniTableField_IsInOneof(field);
    if (_Var1) {
      uVar2 = _upb_Message_GetOneofCase_dont_copy_me__upb_internal_use_only(msg,field);
      uVar3 = upb_MiniTableField_Number(field);
      msg_local._7_1_ = uVar2 == uVar3;
    }
    else {
      msg_local._7_1_ = _upb_Message_GetHasbit_dont_copy_me__upb_internal_use_only(msg,field);
    }
    return msg_local._7_1_;
  }
  __assert_fail("!upb_MiniTableField_IsExtension(field)",
                "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/upb/message/internal/accessors.h"
                ,0xfb,
                "_Bool upb_Message_HasBaseField(const struct upb_Message *, const upb_MiniTableField *)"
               );
}

Assistant:

UPB_API_INLINE bool upb_Message_HasBaseField(const struct upb_Message* msg,
                                             const upb_MiniTableField* field) {
  UPB_ASSERT(upb_MiniTableField_HasPresence(field));
  UPB_ASSUME(!upb_MiniTableField_IsExtension(field));
  if (upb_MiniTableField_IsInOneof(field)) {
    return UPB_PRIVATE(_upb_Message_GetOneofCase)(msg, field) ==
           upb_MiniTableField_Number(field);
  } else {
    return UPB_PRIVATE(_upb_Message_GetHasbit)(msg, field);
  }
}